

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int cd_mapping_init(parser_info *info,char **attr)

{
  xml_element_tag xVar1;
  int iVar2;
  double in_RAX;
  char *pcVar3;
  char *__s1;
  size_t buffer_length;
  long lVar4;
  coda_ascii_float_mapping *pcVar5;
  int iVar6;
  int64_t value;
  double local_28;
  
  local_28 = in_RAX;
  pcVar3 = get_mandatory_attribute_value(attr,"string",info->node->tag);
  iVar6 = -1;
  if (pcVar3 == (char *)0x0) {
    return -1;
  }
  __s1 = get_mandatory_attribute_value(attr,"value",info->node->tag);
  if (__s1 == (char *)0x0) {
    return -1;
  }
  xVar1 = info->node->parent->tag;
  if ((xVar1 == element_cd_float) || (xVar1 == element_cd_time)) {
    iVar2 = strcasecmp(__s1,"nan");
    if (iVar2 == 0) {
      local_28 = coda_NaN();
    }
    else {
      iVar2 = strcasecmp(__s1,"inf");
      if ((iVar2 == 0) || (iVar2 = strcasecmp(__s1,"+inf"), iVar2 == 0)) {
        local_28 = coda_PlusInf();
      }
      else {
        iVar2 = strcasecmp(__s1,"-inf");
        if (iVar2 == 0) {
          local_28 = coda_MinInf();
        }
        else {
          iVar2 = __isoc99_sscanf(__s1,"%lf",&local_28);
          if (iVar2 != 1) {
            pcVar3 = "invalid \'value\' attribute float value \'%s\'";
            goto LAB_001577d7;
          }
        }
      }
    }
    info->node->free_data = coda_ascii_float_mapping_delete;
    pcVar5 = coda_ascii_float_mapping_new(pcVar3,local_28);
  }
  else {
    if (xVar1 != element_cd_integer) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                    ,0x7fd,"int cd_mapping_init(parser_info *, const char **)");
    }
    buffer_length = strlen(__s1);
    lVar4 = coda_ascii_parse_int64(__s1,buffer_length,(int64_t *)&local_28,0);
    if (lVar4 < 0) {
      pcVar3 = "invalid \'value\' attribute integer value \'%s\'";
LAB_001577d7:
      coda_set_error(-400,pcVar3,__s1);
      return -1;
    }
    info->node->free_data = coda_ascii_integer_mapping_delete;
    pcVar5 = (coda_ascii_float_mapping *)coda_ascii_integer_mapping_new(pcVar3,(int64_t)local_28);
  }
  info->node->data = pcVar5;
  if (pcVar5 != (coda_ascii_float_mapping *)0x0) {
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int cd_mapping_init(parser_info *info, const char **attr)
{
    const char *ascii_string;
    const char *value_string;

    ascii_string = get_mandatory_attribute_value(attr, "string", info->node->tag);
    if (ascii_string == NULL)
    {
        return -1;
    }
    value_string = get_mandatory_attribute_value(attr, "value", info->node->tag);
    if (value_string == NULL)
    {
        return -1;
    }
    if (info->node->parent->tag == element_cd_integer)
    {
        int64_t value;

        if (coda_ascii_parse_int64(value_string, (long)strlen(value_string), &value, 0) < 0)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'value' attribute integer value '%s'", value_string);
            return -1;
        }
        info->node->free_data = (free_data_handler)coda_ascii_integer_mapping_delete;
        info->node->data = coda_ascii_integer_mapping_new(ascii_string, value);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }
    else if (info->node->parent->tag == element_cd_float || info->node->parent->tag == element_cd_time)
    {
        double value;

        if (strcasecmp(value_string, "nan") == 0)
        {
            value = coda_NaN();
        }
        else if (strcasecmp(value_string, "inf") == 0 || strcasecmp(value_string, "+inf") == 0)
        {
            value = coda_PlusInf();
        }
        else if (strcasecmp(value_string, "-inf") == 0)
        {
            value = coda_MinInf();
        }
        else if (sscanf(value_string, "%lf", &value) != 1)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'value' attribute float value '%s'", value_string);
            return -1;
        }
        info->node->free_data = (free_data_handler)coda_ascii_float_mapping_delete;
        info->node->data = coda_ascii_float_mapping_new(ascii_string, value);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }
    else
    {
        assert(0);
        exit(1);
    }

    return 0;
}